

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,bool *value)

{
  bool bVar1;
  allocator local_79;
  string local_78;
  char local_51;
  int local_50;
  char sc;
  uint64_t uStack_48;
  bool ok;
  uint64_t loc;
  string tok;
  bool *value_local;
  AsciiParser *this_local;
  
  tok.field_2._8_8_ = value;
  ::std::__cxx11::string::string((string *)&loc);
  uStack_48 = CurrLoc(this);
  sc = ReadIdentifier(this,(string *)&loc);
  if ((bool)sc) {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &loc,"true");
    if (bVar1) {
      *(undefined1 *)tok.field_2._8_8_ = 1;
      this_local._7_1_ = 1;
      local_50 = 1;
      goto LAB_0065cee5;
    }
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &loc,"false");
    if (bVar1) {
      *(undefined1 *)tok.field_2._8_8_ = 0;
      this_local._7_1_ = 1;
      local_50 = 1;
      goto LAB_0065cee5;
    }
  }
  SeekTo(this,uStack_48);
  local_50 = 0;
LAB_0065cee5:
  ::std::__cxx11::string::~string((string *)&loc);
  if (local_50 == 0) {
    bVar1 = Char1(this,&local_51);
    if (bVar1) {
      (this->_curr_cursor).col = (this->_curr_cursor).col + 1;
      if (local_51 == '0') {
        *(undefined1 *)tok.field_2._8_8_ = 0;
        this_local._7_1_ = 1;
      }
      else if (local_51 == '1') {
        *(undefined1 *)tok.field_2._8_8_ = 1;
        this_local._7_1_ = 1;
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_78,"\'0\' or \'1\' expected.\n",&local_79);
        PushError(this,&local_78);
        ::std::__cxx11::string::~string((string *)&local_78);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ReadBasicType(bool *value) {
  // 'true', 'false', '0' or '1'
  {
    std::string tok;

    auto loc = CurrLoc();
    bool ok = ReadIdentifier(&tok);

    if (ok) {
      if (tok == "true") {
        (*value) = true;
        return true;
      } else if (tok == "false") {
        (*value) = false;
        return true;
      }
    }

    // revert
    SeekTo(loc);
  }

  char sc;
  if (!Char1(&sc)) {
    return false;
  }
  _curr_cursor.col++;

  // sign or [0-9]
  if (sc == '0') {
    (*value) = false;
    return true;
  } else if (sc == '1') {
    (*value) = true;
    return true;
  } else {
    PushError("'0' or '1' expected.\n");
    return false;
  }
}